

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

char encode(char input)

{
  char cVar1;
  int iVar2;
  char cVar3;
  bool bVar4;
  
  if ((byte)(input + 0xbfU) < 0x1a) {
    cVar1 = ' ';
    if (input != 'E') {
      if ((input & 1U) == 0) {
        bVar4 = (byte)input < 0x57;
        cVar3 = '\x04';
        cVar1 = -0x16;
      }
      else {
        bVar4 = (byte)input < 0x55;
        cVar3 = '\x06';
        cVar1 = -0x14;
      }
      if (bVar4) {
        cVar1 = cVar3;
      }
      return cVar1 + input;
    }
  }
  else {
    cVar1 = '-';
    if (input == ' ') {
      iVar2 = rand();
      cVar1 = (char)iVar2 +
              ((char)(uint)((ulong)((long)iVar2 * 0x66666667) >> 0x22) - (char)(iVar2 >> 0x1f)) *
              -10 + '0';
    }
  }
  return cVar1;
}

Assistant:

char encode(const char input) {
  if (input >= 'A' && input <= 'Z') {
    if (input == 'E') return ' ';
    if (input % 2) {
      return input + 6 <= 'Z' ? input + 6 : input - 20;
    } else {
      return input + 4 <= 'Z' ? input + 4 : input - 22;
    }
  }
  if (input == ' ') return '0' + (char)(rand() % 10);
  else return '-';
}